

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_trie.cpp
# Opt level: O3

MPP_RET mpp_trie_last_info(MppTrie trie)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  short sVar18;
  int iVar19;
  uint uVar20;
  MPP_RET MVar21;
  void *pvVar22;
  MppTrieNode *pMVar23;
  MppTrieInfo *pMVar24;
  uint uVar25;
  char *pcVar26;
  int iVar27;
  ulong uVar28;
  undefined8 *puVar29;
  ulong uVar30;
  short *psVar31;
  short *psVar32;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  undefined4 *puVar38;
  short *psVar39;
  void *pvVar40;
  long lVar41;
  undefined2 uVar42;
  long lVar43;
  int local_6c;
  void *local_68;
  ulong local_60;
  uint local_54;
  ulong local_50;
  uint *local_48;
  MppTrie local_40;
  ulong local_38;
  
  if (trie == (MppTrie)0x0) {
    _mpp_log_l(2,"mpp_trie","invalid NULL trie\n","mpp_trie_last_info");
    MVar21 = MPP_ERR_NULL_PTR;
  }
  else {
    local_6c = *(int *)((long)trie + 0x18) + 3;
    mpp_trie_add_info(trie,"__name__",*trie,*(RK_U32 *)((long)trie + 8));
    mpp_trie_add_info(trie,"__info__",&local_6c,4);
    local_48 = (uint *)((long)trie + 0x2c);
    mpp_trie_add_info(trie,"__node__",local_48,4);
    local_68 = *(void **)((long)trie + 0x30);
    local_60 = (ulong)*(uint *)((long)trie + 0x2c);
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","shrink trie node start node %d info %d\n","mpp_trie_last_info",
                 local_60,(ulong)*(uint *)((long)trie + 0x18));
    }
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(trie,"mpp_trie_last_info");
    }
    local_54 = (uint)local_60;
    uVar33 = local_60;
    pvVar22 = local_68;
    uVar36 = local_60;
    if (1 < (int)local_54) {
      do {
        uVar30 = uVar33 - 1;
        puVar29 = (undefined8 *)((long)pvVar22 + uVar30 * 0x38);
        sVar18 = *(short *)((long)pvVar22 + uVar30 * 0x38 + 0x26);
        uVar28 = (ulong)sVar18;
        lVar37 = uVar28 * 0x38;
        uVar1 = *(ushort *)((long)pvVar22 + lVar37 + 0x34);
        uVar35 = (ulong)uVar1;
        if (uVar1 < 2) {
          sVar2 = *(short *)((long)puVar29 + 0x32);
          uVar28 = (ulong)(uint)(int)sVar2;
          if (sVar2 < 0x10) {
            puVar38 = (undefined4 *)(lVar37 + (long)pvVar22);
            if ((int)puVar38[8] < 0) {
              puVar38[8] = *(undefined4 *)(puVar29 + 4);
              *(short *)((long)puVar38 + 0x32) = sVar2 + 1;
              uVar35 = (ulong)*(ushort *)(puVar29 + 6) <<
                       ((*(byte *)((long)puVar29 + 0x32) & 0xf) << 2) | puVar29[5];
              *(ulong *)(puVar38 + 10) = uVar35;
              *(undefined2 *)(puVar38 + 0xd) = *(undefined2 *)((long)puVar29 + 0x34);
              uVar6 = *(undefined4 *)puVar29;
              uVar7 = *(undefined4 *)((long)puVar29 + 4);
              uVar8 = *(undefined4 *)(puVar29 + 1);
              uVar9 = *(undefined4 *)((long)puVar29 + 0xc);
              uVar10 = *(undefined4 *)((long)puVar29 + 0x14);
              uVar11 = *(undefined4 *)(puVar29 + 3);
              uVar12 = *(undefined4 *)((long)puVar29 + 0x1c);
              puVar38[4] = *(undefined4 *)(puVar29 + 2);
              puVar38[5] = uVar10;
              puVar38[6] = uVar11;
              puVar38[7] = uVar12;
              *puVar38 = uVar6;
              puVar38[1] = uVar7;
              puVar38[2] = uVar8;
              puVar38[3] = uVar9;
              if ((mpp_trie_debug & 0x20) != 0) {
                local_50 = (ulong)(uint)(int)*(short *)(puVar38 + 9);
                _mpp_log_l(4,"mpp_trie","node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                           "mpp_trie_last_info",uVar30 & 0xffffffff,(ulong)*(uint *)(puVar29 + 4),
                           local_50,(ulong)*(ushort *)(puVar38 + 0xc),puVar29[5],uVar35);
                pvVar22 = local_68;
                uVar36 = local_60;
              }
              lVar37 = 0;
              do {
                lVar41 = (long)*(short *)((long)puVar38 + lVar37 * 2);
                if (lVar41 != 0) {
                  *(short *)((long)pvVar22 + lVar41 * 0x38 + 0x26) = sVar18;
                }
                lVar37 = lVar37 + 1;
              } while (lVar37 != 0x10);
              puVar29[4] = 0;
              puVar29[5] = 0;
              puVar29[2] = 0;
              puVar29[3] = 0;
              *puVar29 = 0;
              puVar29[1] = 0;
              puVar29[6] = 0;
              *(undefined4 *)(puVar29 + 4) = 0xffffffff;
              local_54 = local_54 - 1;
            }
            else if ((mpp_trie_debug & 0x20) != 0) {
              uVar3 = *(uint *)(puVar29 + 4);
              pcVar26 = "node %d:%d tag %d - %016llx stop shrinking for valid info node\n";
              goto LAB_001624fb;
            }
          }
          else if ((mpp_trie_debug & 0x20) != 0) {
            uVar3 = *(uint *)(puVar29 + 4);
            pcVar26 = "node %d:%d tag %d - %016llx stop shrinking for max tag len\n";
LAB_001624fb:
            uVar35 = puVar29[5];
            goto LAB_0016250d;
          }
        }
        else if ((mpp_trie_debug & 0x20) != 0) {
          uVar3 = *(uint *)(puVar29 + 4);
          pcVar26 = "node %d:%d prev %d next count %d stop shrinking for multi next\n";
LAB_0016250d:
          _mpp_log_l(4,"mpp_trie",pcVar26,"mpp_trie_last_info",uVar30 & 0xffffffff,(ulong)uVar3,
                     uVar28,uVar35);
          pvVar22 = local_68;
          uVar36 = local_60;
        }
        bVar5 = 2 < (long)uVar33;
        uVar33 = uVar30;
      } while (bVar5);
    }
    uVar3 = local_54;
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","shrink trie node finish count %d -> %d\n","mpp_trie_last_info",
                 uVar36 & 0xffffffff,(ulong)local_54);
      pvVar22 = local_68;
      uVar36 = local_60;
    }
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(trie,"mpp_trie_last_info");
      pvVar22 = local_68;
      uVar36 = local_60;
    }
    if ((char)mpp_trie_debug < '\0') {
      mpp_trie_check(trie,"shrink merge tag stage");
      pvVar22 = local_68;
      uVar36 = local_60;
    }
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node start to reduce memory %d -> %d\n",
                 "mpp_trie_last_info",uVar36 & 0xffffffff,(ulong)uVar3);
      pvVar22 = local_68;
      uVar36 = local_60;
    }
    if (1 < (int)uVar3) {
      uVar33 = (ulong)(int)uVar36;
      uVar35 = (ulong)local_54;
      psVar39 = (short *)((long)pvVar22 + 0x5e);
      uVar28 = 1;
      pvVar40 = pvVar22;
      local_50 = uVar33;
      local_38 = uVar35;
LAB_0016271f:
      pvVar40 = (void *)((long)pvVar40 + 0x38);
      if ((long)uVar28 < (long)uVar33 && *(short *)((long)pvVar22 + uVar28 * 0x38 + 0x24) == 0) {
        puVar29 = (undefined8 *)(uVar28 * 0x38 + (long)pvVar22);
        psVar31 = psVar39;
        uVar30 = uVar28;
        do {
          sVar18 = psVar31[-1];
          if (sVar18 != 0) {
            if ((mpp_trie_debug & 0x20) != 0) {
              _mpp_log_l(4,"mpp_trie","move node %d to %d prev %d\n","mpp_trie_last_info",uVar30,
                         uVar28 & 0xffffffff,(ulong)(uint)(int)*psVar31);
              sVar18 = psVar31[-1];
              pvVar22 = local_68;
              uVar33 = local_50;
              uVar35 = local_38;
              uVar36 = local_60;
            }
            psVar32 = psVar31 + -0x13;
            lVar37 = 0;
            goto LAB_001627cc;
          }
          uVar30 = uVar30 + 1;
          psVar31 = psVar31 + 0x1c;
        } while (uVar36 != uVar30);
      }
      goto LAB_0016283a;
    }
LAB_0016284e:
    *local_48 = local_54;
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","move trie node finish used %d\n","mpp_trie_last_info");
    }
    if ((mpp_trie_debug & 0x40) != 0) {
      mpp_trie_dump(trie,"mpp_trie_last_info");
    }
    if ((char)mpp_trie_debug < '\0') {
      mpp_trie_check(trie,"shrink move node stage");
    }
    if ((mpp_trie_debug & 0x20) != 0) {
      _mpp_log_l(4,"mpp_trie","create user buffer start\n","mpp_trie_last_info");
    }
    iVar27 = *(int *)((long)trie + 0x2c) * 0x38;
    iVar19 = iVar27 + *(int *)((long)trie + 0x18) * 4 + *(int *)((long)trie + 0x4c) +
             *(int *)((long)trie + 0x54);
    *(int *)((long)trie + 0xc) = iVar19;
    pvVar22 = mpp_osal_calloc("mpp_trie_last_info",(long)iVar19);
    if (pvVar22 == (void *)0x0) {
      _mpp_log_l(2,"mpp_trie","failed to alloc trie buffer size %d\n",(char *)0x0,0);
      MVar21 = MPP_NOK;
    }
    else {
      *(void **)((long)trie + 0x30) = pvVar22;
      memcpy(pvVar22,local_68,(long)iVar27);
      local_6c = iVar27;
      if (0 < *(int *)((long)trie + 0x18)) {
        lVar37 = 0x10;
        lVar41 = 0;
        local_40 = trie;
        do {
          lVar4 = *(long *)((long)local_40 + 0x20);
          pcVar26 = (char *)((long)*(int *)(lVar4 + lVar37) + *(long *)((long)local_40 + 0x40));
          pMVar23 = mpp_trie_get_node(*(MppTrieNode **)((long)local_40 + 0x30),pcVar26);
          lVar43 = (long)local_6c;
          pMVar23->id = local_6c;
          uVar20 = *(uint *)(lVar4 + -0x10 + lVar37) & 0xfff;
          uVar3 = *(uint *)((long)pvVar22 + lVar43);
          *(uint *)((long)pvVar22 + lVar43) = uVar3 & 0xfffff000 | uVar20;
          uVar25 = (*(uint *)(lVar4 + -0xc + lVar37) & 0xfff) << 0xc;
          *(uint *)((long)pvVar22 + lVar43) = uVar3 & 0xff000000 | uVar20 | uVar25;
          *(uint *)((long)pvVar22 + lVar43) =
               *(int *)(lVar4 + -8 + lVar37) << 0x18 | uVar25 | uVar20;
          local_6c = local_6c + 4;
          strncpy((char *)((long)local_6c + (long)pvVar22),pcVar26,
                  (ulong)*(byte *)((long)pvVar22 + lVar43 + 3));
          lVar34 = (long)local_6c + (ulong)*(byte *)((long)pvVar22 + lVar43 + 3);
          local_6c = (int)lVar34;
          memcpy((void *)(lVar34 + (long)pvVar22),
                 (void *)((long)*(int *)(lVar4 + -4 + lVar37) + *(long *)((long)local_40 + 0x38)),
                 (long)*(int *)(lVar4 + -0xc + lVar37));
          local_6c = local_6c + (*(uint *)((long)pvVar22 + lVar43) >> 0xc & 0xfff);
          lVar41 = lVar41 + 1;
          lVar37 = lVar37 + 0x14;
          trie = local_40;
        } while (lVar41 < *(int *)((long)local_40 + 0x18));
      }
      if (local_68 != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",local_68);
      }
      if (*(void **)((long)trie + 0x20) != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)((long)trie + 0x20));
      }
      *(undefined8 *)((long)trie + 0x20) = 0;
      if (*(void **)((long)trie + 0x38) != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)((long)trie + 0x38));
      }
      *(undefined8 *)((long)trie + 0x38) = 0;
      if (*(void **)((long)trie + 0x40) != (void *)0x0) {
        mpp_osal_free("mpp_trie_last_info",*(void **)((long)trie + 0x40));
      }
      *(undefined8 *)((long)trie + 0x40) = 0;
      pMVar24 = mpp_trie_get_info_from_root(*(void **)((long)trie + 0x30),"__node__");
      MVar21 = MPP_OK;
      if (pMVar24 != (MppTrieInfo *)0x0) {
        *(uint *)(&pMVar24[1].field_0x0 + (byte)pMVar24->field_0x3) = *local_48;
        MVar21 = MPP_OK;
      }
    }
  }
  return MVar21;
  while (lVar37 = lVar37 + 1, lVar37 != 0x10) {
LAB_001627cc:
    uVar42 = (undefined2)uVar28;
    if (*(short *)((long)pvVar22 + lVar37 * 2 + (long)*psVar31 * 0x38) == sVar18) {
      *(undefined2 *)((long)pvVar22 + lVar37 * 2 + (long)*psVar31 * 0x38) = uVar42;
      break;
    }
  }
  uVar13 = *(undefined8 *)psVar32;
  uVar14 = *(undefined8 *)(psVar31 + -0xf);
  uVar15 = *(undefined8 *)(psVar31 + -0xb);
  uVar16 = *(undefined8 *)(psVar31 + -7);
  uVar17 = *(undefined8 *)(psVar31 + 1);
  puVar29[4] = *(undefined8 *)(psVar31 + -3);
  puVar29[5] = uVar17;
  puVar29[6] = *(undefined8 *)(psVar31 + 5);
  puVar29[2] = uVar15;
  puVar29[3] = uVar16;
  *puVar29 = uVar13;
  puVar29[1] = uVar14;
  *(undefined2 *)((long)puVar29 + 0x24) = uVar42;
  psVar31[-3] = 0;
  psVar31[-2] = 0;
  psVar31[-1] = 0;
  psVar31[0] = 0;
  psVar31[1] = 0;
  psVar31[2] = 0;
  psVar31[3] = 0;
  psVar31[4] = 0;
  psVar31[-0xb] = 0;
  psVar31[-10] = 0;
  psVar31[-9] = 0;
  psVar31[-8] = 0;
  psVar31[-7] = 0;
  psVar31[-6] = 0;
  psVar31[-5] = 0;
  psVar31[-4] = 0;
  psVar32[0] = 0;
  psVar32[1] = 0;
  psVar32[2] = 0;
  psVar32[3] = 0;
  psVar31[-0xf] = 0;
  psVar31[-0xe] = 0;
  psVar31[-0xd] = 0;
  psVar31[-0xc] = 0;
  psVar31[5] = 0;
  psVar31[6] = 0;
  psVar31[7] = 0;
  psVar31[8] = 0;
  lVar37 = 0;
  do {
    lVar41 = (long)*(short *)((long)pvVar40 + lVar37 * 2);
    if (lVar41 != 0) {
      *(undefined2 *)((long)pvVar22 + lVar41 * 0x38 + 0x26) = uVar42;
    }
    lVar37 = lVar37 + 1;
  } while (lVar37 != 0x10);
LAB_0016283a:
  uVar28 = uVar28 + 1;
  psVar39 = psVar39 + 0x1c;
  if (uVar28 == uVar35) goto LAB_0016284e;
  goto LAB_0016271f;
}

Assistant:

MPP_RET mpp_trie_last_info(MppTrie trie)
{
    MppTrieImpl *p = (MppTrieImpl *)trie;
    MppTrieNode *root;
    MppTrieNode *node;
    char *buf;
    RK_S32 node_count;
    RK_S32 node_valid;
    RK_S32 nodes_size;
    RK_S32 len = 0;
    RK_S32 pos = 0;
    RK_S32 i;
    RK_S32 j;

    if (!trie) {
        mpp_err_f("invalid NULL trie\n");
        return MPP_ERR_NULL_PTR;
    }

    /* write trie self entry info */
    pos = p->info_used + 3;
    mpp_trie_add_info(trie, "__name__", p->name, p->name_len);
    mpp_trie_add_info(trie, "__info__", &pos, sizeof(pos));
    /* NOTE: node count need to be update after shrinking */
    mpp_trie_add_info(trie, "__node__", &p->node_used, sizeof(p->node_used));

    root = p->nodes;
    node_count = p->node_used;
    node_valid = node_count;

    trie_dbg_last("shrink trie node start node %d info %d\n", node_count, p->info_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    for (i = node_count - 1; i > 0; i--) {
        MppTrieNode *prev;
        RK_S32 prev_idx;

        node = &root[i];
        prev_idx = node->prev;
        prev = &root[prev_idx];

        if (prev->next_cnt > 1) {
            trie_dbg_last("node %d:%d prev %d next count %d stop shrinking for multi next\n",
                          i, node->id, prev_idx, prev->next_cnt);
            continue;
        }

        if (node->tag_len >= (RK_S16)MPP_TRIE_TAG_LEN_MAX) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for max tag len\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        if (prev->id >= 0) {
            trie_dbg_last("node %d:%d tag %d - %016llx stop shrinking for valid info node\n",
                          i, node->id, node->tag_len, node->tag_val);
            continue;
        }

        prev->id = node->id;
        /* NOTE: do NOT increase tag length on root node */
        prev->tag_len = node->tag_len + 1;
        prev->tag_val = ((RK_U64)node->key << (node->tag_len * 4)) | node->tag_val;
        prev->next_cnt = node->next_cnt;
        memcpy(prev->next, node->next, sizeof(node->next));

        trie_dbg_last("node %d:%d shrink prev %d key %x tag %016llx -> %016llx\n",
                      i, node->id, prev->idx, prev->key, node->tag_val, prev->tag_val);

        for (j = 0; j < MPP_TRIE_KEY_MAX; j++) {
            if (!prev->next[j])
                continue;

            root[prev->next[j]].prev = prev_idx;
        }

        memset(node, 0, sizeof(*node));
        node->id = INVALID_NODE_ID;
        node_valid--;
    }

    trie_dbg_last("shrink trie node finish count %d -> %d\n", node_count, node_valid);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink merge tag stage");

    trie_dbg_last("move trie node start to reduce memory %d -> %d\n", node_count, node_valid);

    for (i = 1; i < node_valid; i++) {
        node = &root[i];

        /* skip valid node */
        if (node->idx)
            continue;

        for (j = i; j < node_count; j++) {
            MppTrieNode *tmp = &root[j];
            MppTrieNode *prev;
            RK_S32 k;

            /* skip empty node */
            if (!tmp->idx)
                continue;

            trie_dbg_last("move node %d to %d prev %d\n", j, i, tmp->prev);

            prev = &root[tmp->prev];

            /* relink previous node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (prev->next[k] != tmp->idx)
                    continue;

                prev->next[k] = i;
                break;
            }

            memcpy(node, tmp, sizeof(*node));
            node->idx = i;
            memset(tmp, 0, sizeof(*tmp));

            /* relink next node */
            for (k = 0; k < MPP_TRIE_KEY_MAX; k++) {
                if (!node->next[k])
                    continue;

                root[node->next[k]].prev = i;
            }

            break;
        }
    }

    p->node_used = node_valid;

    trie_dbg_last("move trie node finish used %d\n", p->node_used);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_STEP)
        mpp_trie_dump_f(trie);

    if (mpp_trie_debug & MPP_TRIE_DBG_LAST_CHECK)
        mpp_trie_check(trie, "shrink move node stage");

    trie_dbg_last("create user buffer start\n");

    nodes_size = sizeof(MppTrieNode) * p->node_used;
    p->buf_size = nodes_size + sizeof(MppTrieInfo) * p->info_used + p->info_buf_pos + p->name_buf_pos;

    buf = mpp_calloc_size(char, p->buf_size);
    if (!buf) {
        mpp_loge("failed to alloc trie buffer size %d\n", len);
        return MPP_NOK;
    }

    p->nodes = (MppTrieNode *)buf;
    memcpy(p->nodes, root, nodes_size);
    pos = nodes_size;

    for (i = 0; i < p->info_used; i++) {
        MppTrieInfoInt *src = &p->info[i];
        MppTrieInfo *dst;
        const char *name = (char *)p->name_buf + src->name_offset;

        node = mpp_trie_get_node(p->nodes, name);
        node->id = pos;

        /* reserve node info */
        dst = (MppTrieInfo *)(buf + pos);
        dst->index = src->index;
        dst->ctx_len = src->ctx_len;
        dst->str_len = src->str_len;
        pos += sizeof(MppTrieInfo);

        /* copy info name */
        strncpy(buf + pos, name, dst->str_len);
        pos += dst->str_len;

        /* reserve user context space */
        memcpy(buf + pos, (char *)p->info_buf + src->ctx_offset, src->ctx_len);
        pos += dst->ctx_len;
    }

    MPP_FREE(root);
    MPP_FREE(p->info);
    MPP_FREE(p->info_buf);
    MPP_FREE(p->name_buf);

    /* NOTE: udpate final shrinked node count */
    {
        MppTrieInfo *info = mpp_trie_get_info_from_root(p->nodes, "__node__");

        if (info)
            *(RK_U32 *)mpp_trie_info_ctx(info) = p->node_used;
    }

    return MPP_OK;
}